

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O3

Format __thiscall VRasterBuffer::prepare(VRasterBuffer *this,VBitmap *image)

{
  Format FVar1;
  uint8_t *puVar2;
  size_t sVar3;
  
  puVar2 = VBitmap::data(image);
  this->mBuffer = puVar2;
  sVar3 = VBitmap::width(image);
  this->mWidth = sVar3;
  sVar3 = VBitmap::height(image);
  this->mHeight = sVar3;
  this->mBytesPerPixel = 4;
  sVar3 = VBitmap::stride(image);
  this->mBytesPerLine = sVar3;
  FVar1 = VBitmap::format(image);
  this->mFormat = FVar1;
  return FVar1;
}

Assistant:

VBitmap::Format VRasterBuffer::prepare(const VBitmap *image)
{
    mBuffer = image->data();
    mWidth = image->width();
    mHeight = image->height();
    mBytesPerPixel = 4;
    mBytesPerLine = image->stride();

    mFormat = image->format();
    return mFormat;
}